

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_manager_impl.c
# Opt level: O0

void loader_manager_impl_destroy(loader_manager_impl manager_impl)

{
  void *in_RDI;
  vector in_stack_00000010;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 8) != 0) {
      vector_destroy((vector)0x133804);
    }
    if (*(long *)((long)in_RDI + 0x20) != 0) {
      set_destroy((set)manager_impl);
    }
    *(undefined8 *)((long)in_RDI + 0x10) = 0xffffffffffffffff;
    if (*(long *)((long)in_RDI + 0x18) != 0) {
      loader_manager_impl_script_paths_destroy(in_stack_00000010);
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void loader_manager_impl_destroy(loader_manager_impl manager_impl)
{
	if (manager_impl != NULL)
	{
		if (manager_impl->initialization_order != NULL)
		{
			vector_destroy(manager_impl->initialization_order);
		}

		if (manager_impl->destroy_map != NULL)
		{
			set_destroy(manager_impl->destroy_map);
		}

		manager_impl->init_thread_id = THREAD_ID_INVALID;

		if (manager_impl->script_paths != NULL)
		{
			loader_manager_impl_script_paths_destroy(manager_impl->script_paths);
		}

		free(manager_impl);
	}
}